

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O3

void sylvan_rehash_all_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_rehash_all *t)

{
  undefined1 auStack_48 [64];
  
  auStack_48._0_8_ = llmsset_clear_hashes_WRAP;
  auStack_48._8_8_ = (_Worker *)0x1;
  auStack_48._16_8_ = nodes;
  lace_run_task((Task *)auStack_48);
  auStack_48._0_8_ = llmsset_rehash_WRAP;
  auStack_48._8_8_ = (_Worker *)0x1;
  auStack_48._16_8_ = nodes;
  lace_run_task((Task *)auStack_48);
  if (auStack_48._16_4_ == 0) {
    return;
  }
  sylvan_rehash_all_CALL_cold_1();
}

Assistant:

VOID_TASK_IMPL_0(sylvan_rehash_all)
{
    // clear hash array
    llmsset_clear_hashes(nodes);

    // rehash marked nodes
    if (llmsset_rehash(nodes) != 0) {
        fprintf(stderr, "sylvan_gc_rehash error: not all nodes could be rehashed!\n");
        exit(1);
    }
}